

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall
wabt::SimdLoadLaneExpr::SimdLoadLaneExpr
          (SimdLoadLaneExpr *this,Opcode opcode,Var *memidx,Address align,Address offset,
          uint64_t val,Location *loc)

{
  Var VStack_78;
  
  Var::Var(&VStack_78,memidx);
  MemoryExpr<(wabt::ExprType)44>::MemoryExpr
            (&this->super_MemoryExpr<(wabt::ExprType)44>,&VStack_78,loc);
  Var::~Var(&VStack_78);
  (this->super_MemoryExpr<(wabt::ExprType)44>).super_ExprMixin<(wabt::ExprType)44>.super_Expr.
  _vptr_Expr = (_func_int **)&PTR__MemoryExpr_00184678;
  (this->opcode).enum_ = opcode.enum_;
  this->align = align;
  this->offset = offset;
  this->val = val;
  return;
}

Assistant:

SimdLoadLaneExpr(Opcode opcode,
                   Var memidx,
                   Address align,
                   Address offset,
                   uint64_t val,
                   const Location& loc = Location())
      : MemoryExpr<ExprType::SimdLoadLane>(memidx, loc),
        opcode(opcode),
        align(align),
        offset(offset),
        val(val) {}